

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

bool __thiscall mpt::slice::trim(slice *this,ssize_t len)

{
  content *pcVar1;
  ulong uVar2;
  
  if (len < 0) {
    pcVar1 = (this->super_array)._buf._ref;
    if ((pcVar1 == (content *)0x0) || (*(long *)(pcVar1 + 8) != 0)) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ulong *)(pcVar1 + 0x18);
    }
    if ((this->_off - len) + this->_len <= uVar2) goto LAB_0012b40f;
  }
  else if ((ulong)len <= this->_len) {
LAB_0012b40f:
    this->_len = this->_len - len;
    return true;
  }
  return false;
}

Assistant:

bool slice::trim(ssize_t len)
{
	if (len < 0) {
		if (length() < (_off + _len - len)) {
			return false;
		}
	}
	else if ((size_t) len > _len) {
		return false;
	}
	_len -= len;
	return true;
}